

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Station.cpp
# Opt level: O1

list<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_> * __thiscall
imrt::Station::modifyIntensityAperture_abi_cxx11_
          (list<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
           *__return_storage_ptr__,Station *this,int aperture,double size)

{
  size_t *psVar1;
  pointer pdVar2;
  iterator __position;
  pointer pvVar3;
  int iVar4;
  mapped_type *pmVar5;
  _List_node_base *p_Var6;
  double *__args;
  long lVar7;
  long lVar8;
  ulong uVar9;
  mapped_type mVar10;
  double dVar11;
  double dVar12;
  _List_node_base *local_60;
  key_type local_50;
  list<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_> local_48;
  
  (__return_storage_ptr__->
  super__List_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>)._M_impl.
  _M_node.super__List_node_base._M_prev = (_List_node_base *)__return_storage_ptr__;
  (__return_storage_ptr__->
  super__List_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>)._M_impl.
  _M_node.super__List_node_base._M_next = (_List_node_base *)__return_storage_ptr__;
  (__return_storage_ptr__->
  super__List_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>)._M_impl.
  _M_node._M_size = 0;
  p_Var6 = (_List_node_base *)
           (this->intensity).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start[aperture];
  dVar12 = (double)p_Var6 + size;
  if (0.0 <= dVar12) {
    local_60 = (_List_node_base *)size;
    if (dVar12 <= (double)this->max_intensity) goto LAB_0011e2a7;
    if (0.0 <= dVar12) {
      dVar11 = (double)this->max_intensity;
      if (dVar12 <= dVar11) {
        return __return_storage_ptr__;
      }
      if (dVar11 <= (double)p_Var6) {
        return __return_storage_ptr__;
      }
      local_60 = (_List_node_base *)(dVar11 - (double)p_Var6);
      goto LAB_0011e2a7;
    }
  }
  local_60 = p_Var6;
  if ((double)p_Var6 <= 0.0) {
    return __return_storage_ptr__;
  }
LAB_0011e2a7:
  pdVar2 = (this->last_intensity).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((this->last_intensity).super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_finish != pdVar2) {
    (this->last_intensity).super__Vector_base<double,_std::allocator<double>_>._M_impl.
    super__Vector_impl_data._M_finish = pdVar2;
  }
  if (0 < this->max_apertures) {
    lVar8 = 0;
    lVar7 = 0;
    do {
      __args = (double *)
               ((long)(this->intensity).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_start + lVar8);
      __position._M_current =
           (this->last_intensity).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_finish;
      if (__position._M_current ==
          (this->last_intensity).super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<double,std::allocator<double>>::_M_realloc_insert<double_const&>
                  ((vector<double,std::allocator<double>> *)&this->last_intensity,__position,__args)
        ;
      }
      else {
        *__position._M_current = *__args;
        (this->last_intensity).super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_finish = __position._M_current + 1;
      }
      lVar7 = lVar7 + 1;
      lVar8 = lVar8 + 8;
    } while (lVar7 < this->max_apertures);
  }
  pdVar2 = (this->intensity).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  pdVar2[aperture] = pdVar2[aperture] + (double)local_60;
  for (uVar9 = 0; iVar4 = Collimator::getXdim(this->collimator), (long)uVar9 < (long)iVar4;
      uVar9 = uVar9 + 1) {
    pvVar3 = (this->A).
             super__Vector_base<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>,_std::allocator<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    lVar7 = *(long *)&pvVar3[aperture].
                      super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                      ._M_impl.super__Vector_impl_data;
    if ((-1 < *(int *)(lVar7 + uVar9 * 8)) && (-1 < *(int *)(lVar7 + 4 + uVar9 * 8))) {
      local_50 = (key_type)
                 ((ulong)*(uint *)(*(long *)&pvVar3[aperture].
                                             super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                                             ._M_impl.super__Vector_impl_data + uVar9 * 8) << 0x20 |
                 uVar9);
      pmVar5 = std::
               map<std::pair<int,_int>,_int,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<const_std::pair<int,_int>,_int>_>_>
               ::operator[](&this->pos2beam,&local_50);
      lVar7 = *(long *)&(this->A).
                        super__Vector_base<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>,_std::allocator<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start[aperture].
                        super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                        ._M_impl.super__Vector_impl_data;
      iVar4 = *(int *)(lVar7 + uVar9 * 8);
      if (iVar4 <= *(int *)(lVar7 + 4 + uVar9 * 8)) {
        mVar10 = *pmVar5;
        iVar4 = iVar4 + -1;
        do {
          p_Var6 = (_List_node_base *)operator_new(0x20);
          *(mapped_type *)&p_Var6[1]._M_next = mVar10;
          p_Var6[1]._M_prev = local_60;
          std::__detail::_List_node_base::_M_hook(p_Var6);
          psVar1 = &(__return_storage_ptr__->
                    super__List_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                    )._M_impl._M_node._M_size;
          *psVar1 = *psVar1 + 1;
          mVar10 = mVar10 + 1;
          iVar4 = iVar4 + 1;
        } while (iVar4 < *(int *)(*(long *)&(this->A).
                                            super__Vector_base<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>,_std::allocator<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>_>
                                            ._M_impl.super__Vector_impl_data._M_start[aperture].
                                            super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                                            ._M_impl.super__Vector_impl_data + 4 + uVar9 * 8));
      }
    }
  }
  std::__cxx11::list<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>::list
            (&local_48,__return_storage_ptr__);
  updateIntensity(this,&local_48);
  while (local_48.super__List_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
         ._M_impl._M_node.super__List_node_base._M_next != (_List_node_base *)&local_48) {
    p_Var6 = (((_List_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_> *)
              &(local_48.
                super__List_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
                _M_impl._M_node.super__List_node_base._M_next)->_M_next)->_M_impl)._M_node.
             super__List_node_base._M_next;
    operator_delete(local_48.
                    super__List_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                    ._M_impl._M_node.super__List_node_base._M_next);
    local_48.super__List_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
    _M_impl._M_node.super__List_node_base._M_next = p_Var6;
  }
  if (&this->last_diff != __return_storage_ptr__) {
    std::__cxx11::list<std::pair<int,double>,std::allocator<std::pair<int,double>>>::
    _M_assign_dispatch<std::_List_const_iterator<std::pair<int,double>>>
              ((list<std::pair<int,double>,std::allocator<std::pair<int,double>>> *)&this->last_diff
               ,(__return_storage_ptr__->
                super__List_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>).
                _M_impl._M_node.super__List_node_base._M_next,__return_storage_ptr__);
  }
  return __return_storage_ptr__;
}

Assistant:

list <pair< int,double> > Station::modifyIntensityAperture(int aperture, double size) {
    list < pair <int, double > > diff;
    if ((intensity[aperture]+size) < 0 || (intensity[aperture]+size) > max_intensity) {
      if (intensity[aperture]+size < 0) {
        // Too low intensity
        if (intensity[aperture]>0)
          size = intensity[aperture];
        else
          return(diff);
      } else if ((intensity[aperture]+size) > max_intensity) {
        // Too high intensity
        if (intensity[aperture] < max_intensity)
          size = max_intensity - intensity[aperture];
        else 
          return(diff);
      } else {
        return (diff);
      }
    }
    
    // Save previous intensity
    last_intensity.clear();
    for (int i=0;i<max_apertures;i++) 
      last_intensity.push_back(intensity[i]);
    
    intensity[aperture] = intensity[aperture] + size;

    for (int i=0; i<collimator.getXdim(); i++) {
      if (A[aperture][i].first<0 || A[aperture][i].second<0) 
        continue;
      int beamlet = pos2beam[make_pair(i, A[aperture][i].first)];
      for(int j=A[aperture][i].first; j<=A[aperture][i].second; j++){
        diff.push_back(make_pair(beamlet, size));
        beamlet++;
      }
    }
    updateIntensity(diff);
    last_diff = diff;
    return (diff);
  }